

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O2

REF_STATUS ref_sort_heap_int(REF_INT n,REF_INT *original,REF_INT *sorted_index)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  REF_INT RVar7;
  int iVar8;
  int iVar9;
  
  uVar1 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    sorted_index[uVar1] = (REF_INT)uVar1;
  }
  if (n < 2) {
    return 0;
  }
  uVar2 = ((uint)n >> 1) + 1;
  uVar5 = n - 1;
  do {
    if ((int)uVar2 < 2) {
      iVar6 = sorted_index[uVar5];
      RVar7 = original[iVar6];
      sorted_index[uVar5] = *sorted_index;
      uVar5 = uVar5 - 1;
      if (uVar5 == 0) {
        *sorted_index = iVar6;
        return 0;
      }
      uVar2 = 1;
    }
    else {
      uVar1 = (ulong)uVar2;
      uVar2 = uVar2 - 1;
      iVar6 = sorted_index[uVar1 - 2];
      RVar7 = original[iVar6];
    }
    iVar9 = uVar2 * 2 + -1;
    iVar4 = uVar2 - 1;
    while (iVar9 <= (int)uVar5) {
      iVar8 = iVar9;
      if ((iVar9 < (int)uVar5) &&
         (original[sorted_index[iVar9]] < original[sorted_index[(long)iVar9 + 1]])) {
        iVar8 = iVar9 + 1;
      }
      if (original[sorted_index[iVar8]] <= RVar7) break;
      sorted_index[iVar4] = sorted_index[iVar8];
      iVar4 = iVar8;
      iVar9 = iVar8 * 2 + 1;
    }
    sorted_index[iVar4] = iVar6;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_sort_heap_int(REF_INT n, REF_INT *original,
                                     REF_INT *sorted_index) {
  REF_INT i, j, l, ir, indxt, q;

  for (i = 0; i < n; i++) sorted_index[i] = i;

  if (n < 2) return REF_SUCCESS;

  l = (n >> 1) + 1;
  ir = n - 1;
  for (;;) {
    if (l > 1) {
      l--;
      indxt = sorted_index[l - 1];
      q = original[indxt];
    } else {
      indxt = sorted_index[ir];
      q = original[indxt];
      sorted_index[ir] = sorted_index[0];
      if (--ir == 0) {
        sorted_index[0] = indxt;
        break;
      }
    }
    i = l - 1;
    j = l + i;

    while (j <= ir) {
      if (j < ir) {
        if (original[sorted_index[j]] < original[sorted_index[j + 1]]) j++;
      }
      if (q < original[sorted_index[j]]) {
        sorted_index[i] = sorted_index[j];
        i = j;

        j++;
        j <<= 1;
        j--;

      } else
        break;
    }
    sorted_index[i] = indxt;
  }

  return REF_SUCCESS;
}